

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O0

pcp_server_state_e handle_wait_io_timeout(pcp_server_t *s)

{
  undefined1 local_20 [8];
  timeval ctv;
  pcp_server_t *s_local;
  
  (s->next_timeout).tv_sec = 0;
  (s->next_timeout).tv_usec = 0;
  ctv.tv_usec = (__suseconds_t)s;
  pcp_db_foreach_flow(s->ctx,check_flow_timeout,&s->next_timeout);
  if ((*(long *)(ctv.tv_usec + 0x128) != 0) || (*(long *)(ctv.tv_usec + 0x130) != 0)) {
    gettimeofday((timeval *)local_20,(__timezone_ptr_t)0x0);
    *(long *)(ctv.tv_usec + 0x128) = (long)local_20 + *(long *)(ctv.tv_usec + 0x128);
    *(__time_t *)(ctv.tv_usec + 0x130) = ctv.tv_sec + *(long *)(ctv.tv_usec + 0x130);
    timeval_align((timeval *)(ctv.tv_usec + 0x128));
  }
  return pss_wait_io;
}

Assistant:

static pcp_server_state_e handle_wait_io_timeout(pcp_server_t *s) {
    struct timeval ctv;

    s->next_timeout.tv_sec = 0;
    s->next_timeout.tv_usec = 0;

    pcp_db_foreach_flow(s->ctx, check_flow_timeout, &s->next_timeout);

    if ((s->next_timeout.tv_sec != 0) || (s->next_timeout.tv_usec != 0)) {
        gettimeofday(&ctv, NULL);
        s->next_timeout.tv_sec += ctv.tv_sec;
        s->next_timeout.tv_usec += ctv.tv_usec;
        timeval_align(&s->next_timeout);
    }

    return pss_wait_io;
}